

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall
Compiler::detect_error<ParsedGame::ObjectsTokenType>
          (Compiler *this,Token<ParsedGame::ObjectsTokenType> *p_token,string *p_error_msg,
          bool p_is_warning)

{
  uint uVar1;
  element_type *peVar2;
  uint __val;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  uint uVar6;
  undefined7 in_register_00000009;
  long *plVar7;
  ulong uVar8;
  uint __len;
  string __str;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  uVar4 = 3;
  if ((int)CONCAT71(in_register_00000009,p_is_warning) == 0) {
    this->m_has_error = true;
    uVar4 = 4;
  }
  peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,m_compiler_log_cat_abi_cxx11_._M_dataplus._M_p,
             m_compiler_log_cat_abi_cxx11_._M_dataplus._M_p +
             m_compiler_log_cat_abi_cxx11_._M_string_length);
  uVar1 = p_token->token_line;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar8;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00136cb9;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00136cb9;
      }
      if (uVar6 < 10000) goto LAB_00136cb9;
      uVar8 = uVar8 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_00136cb9:
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct((ulong)local_d0,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_d0[0]),__len,__val);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_d0,0,(char *)0x0,0x14c5cf);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(p_error_msg->_M_dataplus)._M_p);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_40 = *plVar7;
    uStack_38 = (undefined4)plVar5[3];
    uStack_34 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar7;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  (*peVar2->_vptr_PSLogger[2])(peVar2,(ulong)uVar4,local_b0);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return;
}

Assistant:

void Compiler::detect_error(Token<T> p_token, string p_error_msg, bool p_is_warning /*= false*/)
{
    if(!p_is_warning)
    {
        m_has_error = true;
    }
    m_logger->log(p_is_warning ? PSLogger::LogType::Warning : PSLogger::LogType::Error, m_compiler_log_cat, "(l." + to_string(p_token.token_line) + ") : " + p_error_msg);
}